

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O3

idx_t __thiscall
duckdb::ArrayColumnData::Fetch
          (ArrayColumnData *this,ColumnScanState *state,row_t row_id,Vector *result)

{
  NotImplementedException *this_00;
  string local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Array Fetch","");
  NotImplementedException::NotImplementedException(this_00,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t ArrayColumnData::Fetch(ColumnScanState &state, row_t row_id, Vector &result) {
	throw NotImplementedException("Array Fetch");
}